

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestCommand.cxx
# Opt level: O2

void __thiscall cmCTestTestCommand::BindArguments(cmCTestTestCommand *this)

{
  cmArgumentParser<void> *this_00;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  static_string_view name_07;
  static_string_view name_08;
  static_string_view name_09;
  static_string_view name_10;
  static_string_view name_11;
  static_string_view name_12;
  static_string_view name_13;
  static_string_view name_14;
  static_string_view name_15;
  static_string_view name_16;
  
  cmCTestHandlerCommand::BindArguments(&this->super_cmCTestHandlerCommand);
  this_00 = &(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>;
  name.super_string_view._M_str = "START";
  name.super_string_view._M_len = 5;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name,&this->Start);
  name_00.super_string_view._M_str = "END";
  name_00.super_string_view._M_len = 3;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_00,&this->End);
  name_01.super_string_view._M_str = "STRIDE";
  name_01.super_string_view._M_len = 6;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_01,&this->Stride);
  name_02.super_string_view._M_str = "EXCLUDE";
  name_02.super_string_view._M_len = 7;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_02,&this->Exclude);
  name_03.super_string_view._M_str = "INCLUDE";
  name_03.super_string_view._M_len = 7;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_03,&this->Include);
  name_04.super_string_view._M_str = "EXCLUDE_LABEL";
  name_04.super_string_view._M_len = 0xd;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_04,&this->ExcludeLabel);
  name_05.super_string_view._M_str = "INCLUDE_LABEL";
  name_05.super_string_view._M_len = 0xd;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_05,&this->IncludeLabel);
  name_06.super_string_view._M_str = "EXCLUDE_FIXTURE";
  name_06.super_string_view._M_len = 0xf;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_06,&this->ExcludeFixture);
  name_07.super_string_view._M_str = "EXCLUDE_FIXTURE_SETUP";
  name_07.super_string_view._M_len = 0x15;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_07,&this->ExcludeFixtureSetup);
  name_08.super_string_view._M_str = "EXCLUDE_FIXTURE_CLEANUP";
  name_08.super_string_view._M_len = 0x17;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_08,&this->ExcludeFixtureCleanup);
  name_09.super_string_view._M_str = "PARALLEL_LEVEL";
  name_09.super_string_view._M_len = 0xe;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_09,&this->ParallelLevel);
  name_10.super_string_view._M_str = "REPEAT";
  name_10.super_string_view._M_len = 6;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_10,&this->Repeat);
  name_11.super_string_view._M_str = "SCHEDULE_RANDOM";
  name_11.super_string_view._M_len = 0xf;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_11,&this->ScheduleRandom);
  name_12.super_string_view._M_str = "STOP_TIME";
  name_12.super_string_view._M_len = 9;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_12,&this->StopTime);
  name_13.super_string_view._M_str = "TEST_LOAD";
  name_13.super_string_view._M_len = 9;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_13,&this->TestLoad);
  name_14.super_string_view._M_str = "RESOURCE_SPEC_FILE";
  name_14.super_string_view._M_len = 0x12;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_14,&this->ResourceSpecFile);
  name_15.super_string_view._M_str = "STOP_ON_FAILURE";
  name_15.super_string_view._M_len = 0xf;
  cmArgumentParser<void>::Bind<bool>(this_00,name_15,&this->StopOnFailure);
  name_16.super_string_view._M_str = "OUTPUT_JUNIT";
  name_16.super_string_view._M_len = 0xc;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_16,&this->OutputJUnit);
  return;
}

Assistant:

void cmCTestTestCommand::BindArguments()
{
  this->cmCTestHandlerCommand::BindArguments();
  this->Bind("START"_s, this->Start);
  this->Bind("END"_s, this->End);
  this->Bind("STRIDE"_s, this->Stride);
  this->Bind("EXCLUDE"_s, this->Exclude);
  this->Bind("INCLUDE"_s, this->Include);
  this->Bind("EXCLUDE_LABEL"_s, this->ExcludeLabel);
  this->Bind("INCLUDE_LABEL"_s, this->IncludeLabel);
  this->Bind("EXCLUDE_FIXTURE"_s, this->ExcludeFixture);
  this->Bind("EXCLUDE_FIXTURE_SETUP"_s, this->ExcludeFixtureSetup);
  this->Bind("EXCLUDE_FIXTURE_CLEANUP"_s, this->ExcludeFixtureCleanup);
  this->Bind("PARALLEL_LEVEL"_s, this->ParallelLevel);
  this->Bind("REPEAT"_s, this->Repeat);
  this->Bind("SCHEDULE_RANDOM"_s, this->ScheduleRandom);
  this->Bind("STOP_TIME"_s, this->StopTime);
  this->Bind("TEST_LOAD"_s, this->TestLoad);
  this->Bind("RESOURCE_SPEC_FILE"_s, this->ResourceSpecFile);
  this->Bind("STOP_ON_FAILURE"_s, this->StopOnFailure);
  this->Bind("OUTPUT_JUNIT"_s, this->OutputJUnit);
}